

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

void __thiscall
spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::clear
          (SmallVector<spirv_cross::Resource,_8UL> *this)

{
  Resource *pRVar1;
  void *pvVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  uVar3 = (this->super_VectorView<spirv_cross::Resource>).buffer_size;
  if (uVar3 != 0) {
    lVar4 = 0x20;
    uVar5 = 0;
    do {
      pRVar1 = (this->super_VectorView<spirv_cross::Resource>).ptr;
      pvVar2 = *(void **)((long)pRVar1 + lVar4 + -0x10);
      if ((void *)((long)&(pRVar1->id).id + lVar4) != pvVar2) {
        operator_delete(pvVar2);
        uVar3 = (this->super_VectorView<spirv_cross::Resource>).buffer_size;
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x30;
    } while (uVar5 < uVar3);
  }
  (this->super_VectorView<spirv_cross::Resource>).buffer_size = 0;
  return;
}

Assistant:

void clear() SPIRV_CROSS_NOEXCEPT
	{
		for (size_t i = 0; i < this->buffer_size; i++)
			this->ptr[i].~T();
		this->buffer_size = 0;
	}